

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

int __thiscall
duckdb::Interpolator<false>::Extract<int,int>(Interpolator<false> *this,int *dest,Vector *result)

{
  idx_t iVar1;
  idx_t iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = this->CRN;
  iVar2 = this->FRN;
  iVar3 = Cast::Operation<int,int>(*dest);
  if (iVar1 != iVar2) {
    iVar4 = Cast::Operation<int,int>(dest[1]);
    iVar3 = (int)((double)(iVar4 - iVar3) *
                  (this->RN -
                  (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25)
                  + ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                 (double)iVar3);
  }
  return iVar3;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}